

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectArcLength.cpp
# Opt level: O2

double GeoCalcs::DirectArcLength
                 (LLPoint *center,double dRadius,double dStartCrs,double dEndCrs,int nOrient,
                 double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = GetArcExtent(dStartCrs,dEndCrs,nOrient,dTol);
  dVar2 = GeometricMeanMeridional(center->latitude);
  dVar3 = PrimeVerticalCurvature(center->latitude);
  dVar3 = dVar3 * dVar2;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar2 = sin(dRadius / dVar3);
  return ABS(dVar2 * dVar1 * dVar3);
}

Assistant:

double DirectArcLength(const LLPoint &center, double dRadius, double dStartCrs, double dEndCrs,
                           int nOrient, double dTol)
    {
        const double dSubtendedAngle = GetArcExtent(dStartCrs, dEndCrs, nOrient, dTol);
        const double R = sqrt(GeometricMeanMeridional(center.latitude) * PrimeVerticalCurvature(center.latitude));
        return fabs(dSubtendedAngle * R * sin(dRadius / R));
    }